

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btTypedConstraint_*>::quickSortInternal<btSortConstraintOnIslandPredicate2>
          (btAlignedObjectArray<btTypedConstraint_*> *this,
          btSortConstraintOnIslandPredicate2 *CompareFunc,int lo,int hi)

{
  btTypedConstraint *rhs;
  btTypedConstraint **ppbVar1;
  btTypedConstraint *pbVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int hi_00;
  long lVar7;
  
  do {
    rhs = this->m_data[(lo + hi) / 2];
    iVar5 = lo;
    hi_00 = hi;
    do {
      lVar6 = (long)iVar5 + -1;
      iVar3 = iVar5;
      do {
        iVar5 = iVar3;
        bVar4 = btSortConstraintOnIslandPredicate2::operator()
                          (CompareFunc,this->m_data[lVar6 + 1],rhs);
        lVar6 = lVar6 + 1;
        iVar3 = iVar5 + 1;
      } while (bVar4);
      lVar7 = (long)hi_00 + 1;
      iVar3 = hi_00;
      do {
        hi_00 = iVar3;
        bVar4 = btSortConstraintOnIslandPredicate2::operator()
                          (CompareFunc,rhs,this->m_data[lVar7 + -1]);
        lVar7 = lVar7 + -1;
        iVar3 = hi_00 + -1;
      } while (bVar4);
      if (lVar6 <= lVar7) {
        ppbVar1 = this->m_data;
        pbVar2 = ppbVar1[lVar6];
        ppbVar1[lVar6] = ppbVar1[lVar7];
        this->m_data[lVar7] = pbVar2;
        iVar5 = iVar5 + 1;
        hi_00 = hi_00 + -1;
      }
    } while (iVar5 <= hi_00);
    if (lo < hi_00) {
      quickSortInternal<btSortConstraintOnIslandPredicate2>(this,CompareFunc,lo,hi_00);
    }
    lo = iVar5;
  } while (iVar5 < hi);
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}